

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

hwaddr arm_cpu_get_phys_page_attrs_debug_aarch64(CPUState *cs,vaddr addr,MemTxAttrs *attrs)

{
  _Bool _Var1;
  ARMMMUIdx mmu_idx_00;
  uint local_80;
  undefined1 local_78 [4];
  ARMMMUIdx mmu_idx;
  ARMMMUFaultInfo_conflict1 fi;
  _Bool ret;
  int prot;
  target_ulong page_size;
  hwaddr phys_addr;
  CPUARMState_conflict *env;
  ARMCPU_conflict1 *cpu;
  MemTxAttrs *attrs_local;
  vaddr addr_local;
  CPUState *cs_local;
  
  phys_addr = (hwaddr)(cs[1].tb_jmp_cache + 0x40b);
  env = (CPUARMState_conflict *)cs;
  cpu = (ARMCPU_conflict1 *)attrs;
  attrs_local = (MemTxAttrs *)addr;
  addr_local = (vaddr)cs;
  memset(local_78,0,0x20);
  mmu_idx_00 = arm_mmu_idx_aarch64((CPUARMState_conflict *)phys_addr);
  (cpu->parent_obj).nr_cores = local_80 & 0xff800000;
  _Var1 = get_phys_addr_aarch64
                    ((CPUARMState_conflict *)phys_addr,(target_ulong)attrs_local,MMU_DATA_LOAD,
                     mmu_idx_00,&page_size,(MemTxAttrs *)cpu,(int *)&fi.field_0x1c,
                     (target_ulong *)&stack0xffffffffffffffb0,(ARMMMUFaultInfo_conflict1 *)local_78,
                     (ARMCacheAttrs *)0x0);
  if (_Var1) {
    cs_local = (CPUState *)0xffffffffffffffff;
  }
  else {
    cs_local = (CPUState *)page_size;
  }
  return (hwaddr)cs_local;
}

Assistant:

hwaddr arm_cpu_get_phys_page_attrs_debug(CPUState *cs, vaddr addr,
                                         MemTxAttrs *attrs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    hwaddr phys_addr;
    target_ulong page_size;
    int prot;
    bool ret;
    ARMMMUFaultInfo fi = { 0 };
    ARMMMUIdx mmu_idx = arm_mmu_idx(env);

    *attrs = (MemTxAttrs) { 0 };

    ret = get_phys_addr(env, addr, 0, mmu_idx, &phys_addr,
                        attrs, &prot, &page_size, &fi, NULL);

    if (ret) {
        return -1;
    }
    return phys_addr;
}